

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::ActivationSoftsign::_InternalParse
          (ActivationSoftsign *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint local_24;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  ActivationSoftsign *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  while( true ) {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)google::protobuf::internal::ReadTag((char *)ctx_local,&local_24,0);
    tag_00 = local_24;
    if ((local_24 == 0) || ((local_24 & 7) == 4)) break;
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  }
  if (ctx_local == (ParseContext *)0x0) {
    return (char *)0x0;
  }
  google::protobuf::internal::EpsCopyInputStream::SetLastTag
            (&pPStack_20->super_EpsCopyInputStream,local_24);
  return (char *)ctx_local;
}

Assistant:

const char* ActivationSoftsign::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}